

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::Extend(ON_RevSurface *this,int dir,ON_Interval *domain)

{
  ON_Interval *this_00;
  ON_Interval *this_01;
  ON_Curve *pOVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval dom;
  ON_Interval a;
  ON_Interval local_70;
  double local_60;
  ON_BoundingBox local_58;
  
  if (1 < (uint)dir) {
    return false;
  }
  iVar5 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])();
  if ((char)iVar5 == '\0') {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    local_70.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_70.m_t[1] = in_XMM1_Qa;
    dVar2 = ON_Interval::operator[](domain,0);
    pdVar6 = ON_Interval::operator[](&local_70,0);
    local_60 = *pdVar6;
    if (dVar2 < local_60) {
      dVar3 = ON_Interval::operator[](domain,0);
      pdVar6 = ON_Interval::operator[](&local_70,0);
      *pdVar6 = dVar3;
    }
    dVar3 = ON_Interval::operator[](domain,1);
    pdVar6 = ON_Interval::operator[](&local_70,1);
    if (dVar3 < *pdVar6 || dVar3 == *pdVar6) {
      if (local_60 <= dVar2) goto LAB_0059f819;
    }
    else {
      dVar2 = ON_Interval::operator[](domain,1);
      pdVar6 = ON_Interval::operator[](&local_70,1);
      *pdVar6 = dVar2;
    }
    iVar5 = 1 - dir;
    if (this->m_bTransposed == false) {
      iVar5 = dir;
    }
    if (iVar5 == 0) {
      this_00 = &this->m_t;
      pdVar6 = ON_Interval::operator[](&local_70,0);
      dVar2 = ON_Interval::NormalizedParameterAt(this_00,*pdVar6);
      pdVar6 = ON_Interval::operator[](&local_70,1);
      dVar3 = ON_Interval::NormalizedParameterAt(this_00,*pdVar6);
      ON_Interval::ON_Interval((ON_Interval *)&local_58);
      this_01 = &this->m_angle;
      dVar2 = ON_Interval::ParameterAt(this_01,dVar2);
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_58,0);
      *pdVar6 = dVar2;
      dVar2 = ON_Interval::ParameterAt(this_01,dVar3);
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_58,1);
      *pdVar6 = dVar2;
      dVar2 = ON_Interval::Length((ON_Interval *)&local_58);
      if (6.283185307412417 < dVar2) {
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_58,0);
        dVar2 = *pdVar6;
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&local_58,1);
        *pdVar6 = dVar2 + 6.283185307179586;
      }
      this_01->m_t[0] = local_58.m_min.x;
      (this->m_angle).m_t[1] = local_58.m_min.y;
      this_00->m_t[0] = local_70.m_t[0];
      (this->m_t).m_t[1] = local_70.m_t[1];
    }
    else {
      pOVar1 = this->m_curve;
      if ((pOVar1 == (ON_Curve *)0x0) ||
         (iVar5 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])
                            (pOVar1,&local_70), (char)iVar5 == '\0')) goto LAB_0059f819;
    }
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    ON_BoundingBox::Destroy(&this->m_bbox);
    ON_Geometry::BoundingBox(&local_58,(ON_Geometry *)this);
    bVar4 = true;
  }
  else {
LAB_0059f819:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_RevSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{
  if ( dir != 0 && dir != 1 ) 
    return false;
  if (IsClosed(dir)) 
    return false;
  bool do_it = false;
  ON_Interval dom = Domain(dir);
  if (domain[0] < dom[0])
  {
    dom[0] = domain[0];
    do_it = true;
  }
  
  if (domain[1] > dom[1])
  {
    dom[1] = domain[1];
    do_it = true;
  }

  if (!do_it) 
    return false;

  if ( m_bTransposed ) 
    dir = 1-dir;

  bool rc = false;

  if ( dir == 0 )
  {
    double t0 = m_t.NormalizedParameterAt(dom[0]);
    double t1 = m_t.NormalizedParameterAt(dom[1]);
    ON_Interval a;
    a[0] = m_angle.ParameterAt(t0);
    a[1] = m_angle.ParameterAt(t1);
    if (a.Length() > 2.0*ON_PI+ON_ZERO_TOLERANCE) a[1] = a[0]+2.0*ON_PI;
    m_angle = a;
    m_t = dom;
    rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Extend(dom);
  }

  if ( rc )
  {
    DestroySurfaceTree();
    // update bounding box
    //ON_BoundingBox bbox0 = m_bbox;
    m_bbox.Destroy();
    BoundingBox();
  }
  return rc;
}